

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void dr_prediction_z3_8x4_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *left,int upsample_left,int dy)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar55;
  int iVar56;
  int iVar57;
  undefined1 (*pauVar58) [16];
  undefined1 (*pauVar59) [16];
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  longlong *in_RDI;
  uint in_R8D;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  __m128i d [4];
  __m128i dstvec [8];
  int i;
  int base_max_diff;
  int base;
  __m128i a1_128;
  __m128i a0_128;
  __m128i res1;
  __m256i shift;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m128i a_mbase_x;
  __m256i c3f;
  __m256i diff;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  longlong local_840 [2];
  longlong local_830 [2];
  longlong local_820 [2];
  longlong local_810 [2];
  longlong local_800 [4];
  longlong local_7e0 [2];
  longlong local_7d0 [2];
  longlong local_7c0 [2];
  longlong local_7b0 [2];
  longlong local_7a0 [2];
  longlong local_790 [4];
  long local_770;
  longlong *local_768;
  int local_6dc;
  int local_6d8;
  int local_6d4;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  int local_638;
  uint local_634;
  longlong local_630;
  longlong lStack_628;
  undefined1 local_620 [16];
  undefined1 auStack_610 [16];
  undefined1 local_600 [32];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  int local_548;
  int local_544;
  byte local_53c;
  longlong *local_530;
  undefined4 local_528;
  undefined4 local_524;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  ushort local_488;
  ushort local_486;
  undefined2 local_484;
  undefined2 local_482;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_450;
  undefined8 uStack_448;
  uint8_t local_440 [8];
  uint8_t auStack_438 [8];
  undefined8 local_430;
  undefined8 uStack_428;
  undefined1 local_420 [16];
  undefined1 auStack_410 [16];
  undefined2 local_400;
  undefined2 local_3fe;
  undefined2 local_3fc;
  undefined2 local_3fa;
  undefined2 local_3f8;
  undefined2 local_3f6;
  undefined2 local_3f4;
  undefined2 local_3f2;
  undefined2 local_3f0;
  undefined2 local_3ee;
  undefined2 local_3ec;
  undefined2 local_3ea;
  undefined2 local_3e8;
  undefined2 local_3e6;
  undefined2 local_3e4;
  undefined2 local_3e2;
  undefined1 local_3e0 [32];
  undefined2 local_3c0;
  undefined2 local_3be;
  undefined2 local_3bc;
  undefined2 local_3ba;
  undefined2 local_3b8;
  undefined2 local_3b6;
  undefined2 local_3b4;
  undefined2 local_3b2;
  undefined2 local_3b0;
  undefined2 local_3ae;
  undefined2 local_3ac;
  undefined2 local_3aa;
  undefined2 local_3a8;
  undefined2 local_3a6;
  undefined2 local_3a4;
  undefined2 local_3a2;
  undefined1 local_3a0 [32];
  ushort local_380;
  ushort local_37e;
  ushort local_37c;
  ushort local_37a;
  ushort local_378;
  ushort local_376;
  ushort local_374;
  ushort local_372;
  ushort local_370;
  ushort local_36e;
  ushort local_36c;
  ushort local_36a;
  ushort local_368;
  ushort local_366;
  ushort local_364;
  ushort local_362;
  undefined1 local_360 [32];
  ushort local_340;
  ushort local_33e;
  ushort local_33c;
  ushort local_33a;
  ushort local_338;
  ushort local_336;
  ushort local_334;
  ushort local_332;
  ushort local_330;
  ushort local_32e;
  ushort local_32c;
  ushort local_32a;
  ushort local_328;
  ushort local_326;
  ushort local_324;
  ushort local_322;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 auStack_310 [16];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [16];
  undefined1 auStack_290 [16];
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  undefined1 local_260 [16];
  undefined1 auStack_250 [16];
  undefined1 local_240 [32];
  undefined1 (*local_218) [16];
  undefined1 (*local_210) [16];
  undefined4 local_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined4 local_1c4;
  undefined1 local_1c0 [32];
  undefined4 local_184;
  undefined1 local_180 [32];
  undefined4 local_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  longlong local_80;
  longlong lStack_78;
  byte local_61;
  undefined1 local_60 [16];
  byte local_50;
  byte local_4f;
  byte local_4e;
  byte local_4d;
  byte local_4c;
  byte local_4b;
  byte local_4a;
  byte local_49;
  byte local_48;
  byte local_47;
  byte local_46;
  byte local_45;
  byte local_44;
  byte local_43;
  byte local_42;
  byte local_41;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  auVar54._8_8_ = auStack_290._8_8_;
  auVar54._0_8_ = auStack_290._0_8_;
  auVar53._8_8_ = local_2a0._8_8_;
  auVar53._0_8_ = local_2a0._0_8_;
  auVar52._8_8_ = auStack_250._8_8_;
  auVar52._0_8_ = auStack_250._0_8_;
  auVar51._8_8_ = local_260._8_8_;
  auVar51._0_8_ = local_260._0_8_;
  auVar61._24_8_ = auStack_f0._8_8_;
  auVar61._16_8_ = auStack_f0._0_8_;
  auVar61._8_8_ = local_100._8_8_;
  auVar61._0_8_ = local_100._0_8_;
  auVar62._24_8_ = auStack_270._8_8_;
  auVar62._16_8_ = auStack_270._0_8_;
  auVar62._8_8_ = local_280._8_8_;
  auVar62._0_8_ = local_280._0_8_;
  local_524 = 4;
  local_528 = 8;
  local_53c = (byte)in_ECX;
  iVar55 = 0xb << (local_53c & 0x1f);
  local_482 = 0x10;
  local_3e2 = 0x10;
  local_3e4 = 0x10;
  local_3e6 = 0x10;
  local_3e8 = 0x10;
  local_3ea = 0x10;
  local_3ec = 0x10;
  local_3ee = 0x10;
  local_3f0 = 0x10;
  local_3f2 = 0x10;
  local_3f4 = 0x10;
  local_3f6 = 0x10;
  local_3f8 = 0x10;
  local_3fa = 0x10;
  local_3fc = 0x10;
  local_3fe = 0x10;
  local_400 = 0x10;
  auVar2 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar2 = vpinsrw_avx(auVar2,0x10,2);
  auVar2 = vpinsrw_avx(auVar2,0x10,3);
  auVar2 = vpinsrw_avx(auVar2,0x10,4);
  auVar2 = vpinsrw_avx(auVar2,0x10,5);
  auVar2 = vpinsrw_avx(auVar2,0x10,6);
  auVar3 = vpinsrw_avx(auVar2,0x10,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar2 = vpinsrw_avx(auVar2,0x10,2);
  auVar2 = vpinsrw_avx(auVar2,0x10,3);
  auVar2 = vpinsrw_avx(auVar2,0x10,4);
  auVar2 = vpinsrw_avx(auVar2,0x10,5);
  auVar2 = vpinsrw_avx(auVar2,0x10,6);
  auVar4 = vpinsrw_avx(auVar2,0x10,7);
  local_420._0_8_ = auVar3._0_8_;
  local_420._8_8_ = auVar3._8_8_;
  auStack_410._0_8_ = auVar4._0_8_;
  auStack_410._8_8_ = auVar4._8_8_;
  local_5e0 = local_420._0_8_;
  uStack_5d8 = local_420._8_8_;
  uStack_5d0 = auStack_410._0_8_;
  uStack_5c8 = auStack_410._8_8_;
  bVar1 = *(byte *)(in_RDX + iVar55);
  auVar2 = vpinsrb_avx(ZEXT116(bVar1),(uint)bVar1,1);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,2);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,3);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,4);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,5);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,6);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,7);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,8);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,9);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,10);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xb);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xc);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xd);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xe);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xf);
  local_60._0_8_ = auVar2._0_8_;
  local_60._8_8_ = auVar2._8_8_;
  local_630 = local_60._0_8_;
  lStack_628 = local_60._8_8_;
  local_484 = 0x3f;
  local_3a2 = 0x3f;
  local_3a4 = 0x3f;
  local_3a6 = 0x3f;
  local_3a8 = 0x3f;
  local_3aa = 0x3f;
  local_3ac = 0x3f;
  local_3ae = 0x3f;
  local_3b0 = 0x3f;
  local_3b2 = 0x3f;
  local_3b4 = 0x3f;
  local_3b6 = 0x3f;
  local_3b8 = 0x3f;
  local_3ba = 0x3f;
  local_3bc = 0x3f;
  local_3be = 0x3f;
  local_3c0 = 0x3f;
  auVar5 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar5 = vpinsrw_avx(auVar5,0x3f,2);
  auVar5 = vpinsrw_avx(auVar5,0x3f,3);
  auVar5 = vpinsrw_avx(auVar5,0x3f,4);
  auVar5 = vpinsrw_avx(auVar5,0x3f,5);
  auVar5 = vpinsrw_avx(auVar5,0x3f,6);
  auVar5 = vpinsrw_avx(auVar5,0x3f,7);
  auVar63 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar63 = vpinsrw_avx(auVar63,0x3f,2);
  auVar63 = vpinsrw_avx(auVar63,0x3f,3);
  auVar63 = vpinsrw_avx(auVar63,0x3f,4);
  auVar63 = vpinsrw_avx(auVar63,0x3f,5);
  auVar63 = vpinsrw_avx(auVar63,0x3f,6);
  auVar63 = vpinsrw_avx(auVar63,0x3f,7);
  auVar60._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar63;
  auVar60._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar5;
  local_3e0._16_8_ = auVar60._16_8_;
  local_3e0._24_8_ = auVar60._24_8_;
  local_638 = 0;
  local_634 = in_R8D;
  while( true ) {
    if (7 < local_638) goto LAB_005ceafb;
    iVar56 = (int)local_634 >> ((byte)(6 - in_ECX) & 0x1f);
    iVar57 = iVar55 - iVar56 >> (local_53c & 0x1f);
    local_6d8 = iVar57;
    local_6d4 = iVar56;
    if (iVar57 < 1) break;
    if (4 < iVar57) {
      local_6d8 = 4;
    }
    pauVar58 = (undefined1 (*) [16])(in_RDX + iVar56);
    local_6c0 = *pauVar58;
    pauVar59 = (undefined1 (*) [16])(in_RDX + iVar56 + 1);
    local_6d0 = *pauVar59;
    if (in_ECX == 0) {
      local_488 = (ushort)local_634;
      local_322 = (ushort)local_634;
      local_324 = (ushort)local_634;
      local_326 = (ushort)local_634;
      local_328 = (ushort)local_634;
      local_32a = (ushort)local_634;
      local_32c = (ushort)local_634;
      local_32e = (ushort)local_634;
      local_330 = (ushort)local_634;
      local_332 = (ushort)local_634;
      local_334 = (ushort)local_634;
      local_336 = (ushort)local_634;
      local_338 = (ushort)local_634;
      local_33a = (ushort)local_634;
      local_33c = (ushort)local_634;
      local_33e = (ushort)local_634;
      local_340 = (ushort)local_634;
      auVar5 = vpinsrw_avx(ZEXT216((ushort)local_634),local_634 & 0xffff,1);
      auVar5 = vpinsrw_avx(auVar5,local_634 & 0xffff,2);
      auVar5 = vpinsrw_avx(auVar5,local_634 & 0xffff,3);
      auVar5 = vpinsrw_avx(auVar5,local_634 & 0xffff,4);
      auVar5 = vpinsrw_avx(auVar5,local_634 & 0xffff,5);
      auVar5 = vpinsrw_avx(auVar5,local_634 & 0xffff,6);
      auVar5 = vpinsrw_avx(auVar5,local_634 & 0xffff,7);
      auVar63 = vpinsrw_avx(ZEXT216((ushort)local_634),local_634 & 0xffff,1);
      auVar63 = vpinsrw_avx(auVar63,local_634 & 0xffff,2);
      auVar63 = vpinsrw_avx(auVar63,local_634 & 0xffff,3);
      auVar63 = vpinsrw_avx(auVar63,local_634 & 0xffff,4);
      auVar63 = vpinsrw_avx(auVar63,local_634 & 0xffff,5);
      auVar63 = vpinsrw_avx(auVar63,local_634 & 0xffff,6);
      auVar63 = vpinsrw_avx(auVar63,local_634 & 0xffff,7);
      auVar62._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar63;
      auVar62._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar5;
      local_360._16_8_ = auVar62._16_8_;
      local_360._24_8_ = auVar62._24_8_;
      auVar6._16_8_ = local_360._16_8_;
      auVar6._0_16_ = auVar62._0_16_;
      auVar6._24_8_ = local_360._24_8_;
      auVar10._16_8_ = local_3e0._16_8_;
      auVar10._0_16_ = auVar60._0_16_;
      auVar10._24_8_ = local_3e0._24_8_;
      local_1c0 = vpand_avx2(auVar6,auVar10);
      local_1c4 = 1;
      local_6a0 = vpsrlw_avx2(local_1c0,ZEXT416(1));
      local_360 = auVar62;
      auVar53 = auVar60._0_16_;
      auVar54 = auVar60._16_16_;
    }
    else {
      local_440 = (uint8_t  [8])EvenOddMaskx[0]._0_8_;
      auStack_438 = (uint8_t  [8])EvenOddMaskx[0]._8_8_;
      auVar5._8_8_ = EvenOddMaskx[0]._8_8_;
      auVar5._0_8_ = EvenOddMaskx[0]._0_8_;
      local_6c0 = vpshufb_avx(*pauVar58,auVar5);
      local_6d0 = vpsrldq_avx(local_6c0,8);
      local_486 = (ushort)local_634;
      local_362 = (ushort)local_634;
      local_364 = (ushort)local_634;
      local_366 = (ushort)local_634;
      local_368 = (ushort)local_634;
      local_36a = (ushort)local_634;
      local_36c = (ushort)local_634;
      local_36e = (ushort)local_634;
      local_370 = (ushort)local_634;
      local_372 = (ushort)local_634;
      local_374 = (ushort)local_634;
      local_376 = (ushort)local_634;
      local_378 = (ushort)local_634;
      local_37a = (ushort)local_634;
      local_37c = (ushort)local_634;
      local_37e = (ushort)local_634;
      local_380 = (ushort)local_634;
      auVar5 = vpinsrw_avx(ZEXT216((ushort)local_634),local_634 & 0xffff,1);
      auVar5 = vpinsrw_avx(auVar5,local_634 & 0xffff,2);
      auVar5 = vpinsrw_avx(auVar5,local_634 & 0xffff,3);
      auVar5 = vpinsrw_avx(auVar5,local_634 & 0xffff,4);
      auVar5 = vpinsrw_avx(auVar5,local_634 & 0xffff,5);
      auVar5 = vpinsrw_avx(auVar5,local_634 & 0xffff,6);
      auVar5 = vpinsrw_avx(auVar5,local_634 & 0xffff,7);
      auVar63 = vpinsrw_avx(ZEXT216((ushort)local_634),local_634 & 0xffff,1);
      auVar63 = vpinsrw_avx(auVar63,local_634 & 0xffff,2);
      auVar63 = vpinsrw_avx(auVar63,local_634 & 0xffff,3);
      auVar63 = vpinsrw_avx(auVar63,local_634 & 0xffff,4);
      auVar63 = vpinsrw_avx(auVar63,local_634 & 0xffff,5);
      auVar63 = vpinsrw_avx(auVar63,local_634 & 0xffff,6);
      auVar63 = vpinsrw_avx(auVar63,local_634 & 0xffff,7);
      auVar61._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar63;
      auVar61._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar5;
      local_3a0._16_8_ = auVar61._16_8_;
      local_3a0._24_8_ = auVar61._24_8_;
      auVar8._16_8_ = local_3a0._16_8_;
      auVar8._0_16_ = auVar61._0_16_;
      auVar8._24_8_ = local_3a0._24_8_;
      local_240 = vpsllw_avx2(auVar8,ZEXT416(in_ECX));
      auVar7._16_8_ = local_3e0._16_8_;
      auVar7._0_16_ = auVar60._0_16_;
      auVar7._24_8_ = local_3e0._24_8_;
      local_180 = vpand_avx2(local_240,auVar7);
      local_184 = 1;
      local_6a0 = vpsrlw_avx2(local_180,ZEXT416(1));
      local_430 = *(undefined8 *)*pauVar58;
      uStack_428 = *(undefined8 *)(*pauVar58 + 8);
      local_3a0 = auVar61;
      auVar51 = auVar60._0_16_;
      auVar52 = auVar60._16_16_;
    }
    auVar7 = vpmovzxbw_avx2(local_6c0);
    auVar8 = vpmovzxbw_avx2(local_6d0);
    local_5a0._0_8_ = auVar8._0_8_;
    uVar18 = local_5a0._0_8_;
    local_5a0._8_8_ = auVar8._8_8_;
    uVar19 = local_5a0._8_8_;
    local_5a0._16_8_ = auVar8._16_8_;
    uVar20 = local_5a0._16_8_;
    local_5a0._24_8_ = auVar8._24_8_;
    uVar21 = local_5a0._24_8_;
    local_580._0_8_ = auVar7._0_8_;
    uVar22 = local_580._0_8_;
    local_580._8_8_ = auVar7._8_8_;
    uVar23 = local_580._8_8_;
    local_580._16_8_ = auVar7._16_8_;
    uVar24 = local_580._16_8_;
    local_580._24_8_ = auVar7._24_8_;
    uVar25 = local_580._24_8_;
    auVar11 = vpsubw_avx2(auVar8,auVar7);
    local_144 = 5;
    auVar10 = vpsllw_avx2(auVar7,ZEXT416(5));
    local_5c0._0_8_ = auVar10._0_8_;
    uVar26 = local_5c0._0_8_;
    local_5c0._8_8_ = auVar10._8_8_;
    uVar27 = local_5c0._8_8_;
    local_5c0._16_8_ = auVar10._16_8_;
    uVar28 = local_5c0._16_8_;
    local_5c0._24_8_ = auVar10._24_8_;
    uVar29 = local_5c0._24_8_;
    auVar9._16_8_ = auStack_410._0_8_;
    auVar9._0_16_ = auVar3;
    auVar9._24_8_ = auStack_410._8_8_;
    auVar6 = vpaddw_avx2(auVar10,auVar9);
    local_600._0_8_ = auVar11._0_8_;
    uVar30 = local_600._0_8_;
    local_600._8_8_ = auVar11._8_8_;
    uVar31 = local_600._8_8_;
    local_600._16_8_ = auVar11._16_8_;
    uVar32 = local_600._16_8_;
    local_600._24_8_ = auVar11._24_8_;
    uVar33 = local_600._24_8_;
    auVar9 = vpmullw_avx2(auVar11,local_6a0);
    local_5c0._0_8_ = auVar6._0_8_;
    uVar34 = local_5c0._0_8_;
    local_5c0._8_8_ = auVar6._8_8_;
    uVar35 = local_5c0._8_8_;
    local_5c0._16_8_ = auVar6._16_8_;
    uVar36 = local_5c0._16_8_;
    local_5c0._24_8_ = auVar6._24_8_;
    uVar37 = local_5c0._24_8_;
    local_660._0_8_ = auVar9._0_8_;
    uVar38 = local_660._0_8_;
    local_660._8_8_ = auVar9._8_8_;
    uVar39 = local_660._8_8_;
    local_660._16_8_ = auVar9._16_8_;
    uVar40 = local_660._16_8_;
    local_660._24_8_ = auVar9._24_8_;
    uVar41 = local_660._24_8_;
    auVar10 = vpaddw_avx2(auVar6,auVar9);
    local_680._0_8_ = auVar10._0_8_;
    uVar42 = local_680._0_8_;
    local_680._8_8_ = auVar10._8_8_;
    uVar43 = local_680._8_8_;
    local_680._16_8_ = auVar10._16_8_;
    uVar44 = local_680._16_8_;
    local_680._24_8_ = auVar10._24_8_;
    uVar45 = local_680._24_8_;
    local_204 = 5;
    auVar63 = ZEXT416(5);
    auVar10 = vpsrlw_avx2(auVar10,auVar63);
    local_680._0_8_ = auVar10._0_8_;
    uVar46 = local_680._0_8_;
    local_680._8_8_ = auVar10._8_8_;
    uVar47 = local_680._8_8_;
    local_680._16_8_ = auVar10._16_8_;
    uVar12 = local_680._16_8_;
    local_680._24_8_ = auVar10._24_8_;
    uVar13 = local_680._24_8_;
    auVar50._16_16_ = auVar63;
    auVar50._0_16_ = auVar10._16_16_;
    auVar10 = vpackuswb_avx2(auVar10,auVar50);
    local_680._0_8_ = auVar10._0_8_;
    uVar14 = local_680._0_8_;
    local_680._8_8_ = auVar10._8_8_;
    uVar15 = local_680._8_8_;
    local_680._16_8_ = auVar10._16_8_;
    uVar48 = local_680._16_8_;
    local_680._24_8_ = auVar10._24_8_;
    uVar49 = local_680._24_8_;
    uVar16 = *(undefined8 *)BaseMask[local_6d8];
    uVar17 = *(undefined8 *)(BaseMask[local_6d8] + 8);
    auVar5 = vpblendvb_avx(auVar2,auVar10._0_16_,*(undefined1 (*) [16])BaseMask[local_6d8]);
    *(undefined1 (*) [16])(local_800 + (long)local_638 * 2) = auVar5;
    local_634 = in_R8D + local_634;
    local_638 = local_638 + 1;
    local_6b0 = local_680._0_8_;
    uStack_6a8 = local_680._8_8_;
    local_680 = auVar10;
    local_660 = auVar9;
    local_600 = auVar11;
    local_5c0 = auVar6;
    local_5a0 = auVar8;
    local_580 = auVar7;
    local_520 = uVar38;
    uStack_518 = uVar39;
    uStack_510 = uVar40;
    uStack_508 = uVar41;
    local_500 = uVar34;
    uStack_4f8 = uVar35;
    uStack_4f0 = uVar36;
    uStack_4e8 = uVar37;
    local_4e0 = local_420._0_8_;
    uStack_4d8 = local_420._8_8_;
    uStack_4d0 = auStack_410._0_8_;
    uStack_4c8 = auStack_410._8_8_;
    local_4c0 = uVar26;
    uStack_4b8 = uVar27;
    uStack_4b0 = uVar28;
    uStack_4a8 = uVar29;
    local_480 = uVar14;
    uStack_478 = uVar15;
    uStack_470 = uVar48;
    uStack_468 = uVar49;
    local_450 = uVar12;
    uStack_448 = uVar13;
    local_320 = uVar12;
    uStack_318 = uVar13;
    auStack_310 = auVar63;
    local_300 = uVar46;
    uStack_2f8 = uVar47;
    uStack_2f0 = uVar12;
    uStack_2e8 = uVar13;
    local_2e0 = uVar22;
    uStack_2d8 = uVar23;
    uStack_2d0 = uVar24;
    uStack_2c8 = uVar25;
    local_2c0 = uVar18;
    uStack_2b8 = uVar19;
    uStack_2b0 = uVar20;
    uStack_2a8 = uVar21;
    local_218 = pauVar59;
    local_210 = pauVar58;
    local_200 = uVar42;
    uStack_1f8 = uVar43;
    uStack_1f0 = uVar44;
    uStack_1e8 = uVar45;
    local_140 = uVar22;
    uStack_138 = uVar23;
    uStack_130 = uVar24;
    uStack_128 = uVar25;
    local_e0 = local_6a0._0_8_;
    uStack_d8 = local_6a0._8_8_;
    uStack_d0 = local_6a0._16_8_;
    uStack_c8 = local_6a0._24_8_;
    local_c0 = uVar30;
    uStack_b8 = uVar31;
    uStack_b0 = uVar32;
    uStack_a8 = uVar33;
    local_a0 = uVar16;
    uStack_98 = uVar17;
    local_90 = uVar14;
    uStack_88 = uVar15;
    local_80 = local_60._0_8_;
    lStack_78 = local_60._8_8_;
    local_40 = local_6d0._0_8_;
    uStack_38 = local_6d0._8_8_;
    local_30 = local_6c0._0_8_;
    uStack_28 = local_6c0._8_8_;
  }
  for (local_6dc = local_638; local_6dc < 8; local_6dc = local_6dc + 1) {
    local_800[(long)local_6dc * 2] = local_60._0_8_;
    local_800[(long)local_6dc * 2 + 1] = local_60._8_8_;
  }
LAB_005ceafb:
  local_770 = in_RSI;
  local_768 = in_RDI;
  local_548 = iVar55;
  local_544 = 6 - in_ECX;
  local_530 = local_800;
  local_420 = auVar3;
  auStack_410 = auVar4;
  local_3e0 = auVar60;
  local_61 = bVar1;
  local_60 = auVar2;
  local_50 = bVar1;
  local_4f = bVar1;
  local_4e = bVar1;
  local_4d = bVar1;
  local_4c = bVar1;
  local_4b = bVar1;
  local_4a = bVar1;
  local_49 = bVar1;
  local_48 = bVar1;
  local_47 = bVar1;
  local_46 = bVar1;
  local_45 = bVar1;
  local_44 = bVar1;
  local_43 = bVar1;
  local_42 = bVar1;
  local_41 = bVar1;
  local_620 = auVar60._0_16_;
  auStack_610 = auVar60._16_16_;
  local_280 = auVar62._0_16_;
  auStack_270 = auVar62._16_16_;
  local_100 = auVar61._0_16_;
  auStack_f0 = auVar61._16_16_;
  local_260 = auVar51;
  auStack_250 = auVar52;
  local_2a0 = auVar53;
  auStack_290 = auVar54;
  transpose8x8_low_sse2
            ((__m128i *)local_800,(__m128i *)(local_800 + 2),(__m128i *)(local_800 + 4),&local_7d0,
             &local_7c0,&local_7b0,&local_7a0,(__m128i *)local_790,&local_840,&local_830,&local_820,
             &local_810);
  *local_768 = local_840[0];
  *(longlong *)((long)local_768 + local_770) = local_830[0];
  *(longlong *)((long)local_768 + local_770 * 2) = local_820[0];
  *(longlong *)((long)local_768 + local_770 * 3) = local_810[0];
  return;
}

Assistant:

static void dr_prediction_z3_8x4_avx2(uint8_t *dst, ptrdiff_t stride,
                                      const uint8_t *left, int upsample_left,
                                      int dy) {
  __m128i dstvec[8], d[4];

  dr_prediction_z1_HxW_internal_avx2(4, 8, dstvec, left, upsample_left, dy);
  transpose8x8_low_sse2(&dstvec[0], &dstvec[1], &dstvec[2], &dstvec[3],
                        &dstvec[4], &dstvec[5], &dstvec[6], &dstvec[7], &d[0],
                        &d[1], &d[2], &d[3]);
  _mm_storel_epi64((__m128i *)(dst + 0 * stride), d[0]);
  _mm_storel_epi64((__m128i *)(dst + 1 * stride), d[1]);
  _mm_storel_epi64((__m128i *)(dst + 2 * stride), d[2]);
  _mm_storel_epi64((__m128i *)(dst + 3 * stride), d[3]);
}